

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O2

int4 __thiscall Sleigh::oneInstruction(Sleigh *this,PcodeEmit *emit,Address *baseaddr)

{
  PcodeCacher *this_00;
  int iVar1;
  ParserContext *this_01;
  ParserContext *this_02;
  ostream *s_00;
  LowlevelError *this_03;
  ulong uVar2;
  int4 iVar3;
  int off;
  int4 bytecount;
  int iVar4;
  ostringstream s;
  uintb local_288;
  SleighBuilder builder;
  ParserWalker walker;
  
  uVar2 = (ulong)(this->super_SleighBase).super_Translate.alignment;
  if ((uVar2 != 1) && (baseaddr->offset % uVar2 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    s_00 = std::operator<<((ostream *)&s,"Instruction address not aligned: ");
    operator<<(s_00,baseaddr);
    this_03 = (LowlevelError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LowlevelError::LowlevelError(this_03,(string *)&walker);
    *(undefined4 *)&this_03[1].explain._M_dataplus._M_p = 0;
    __cxa_throw(this_03,&UnimplError::typeinfo,LowlevelError::~LowlevelError);
  }
  this_01 = obtainContext(this,baseaddr,2);
  ParserContext::applyCommits(this_01);
  walker.point = this_01->base_state;
  iVar3 = (walker.point)->length;
  if (0 < this_01->delayslot) {
    off = (int)this_01 + 0x50;
    iVar4 = 0;
    do {
      Address::operator+((Address *)&s,off);
      this_02 = obtainContext(this,(Address *)&s,2);
      ParserContext::applyCommits(this_02);
      iVar1 = this_02->base_state->length;
      iVar3 = iVar3 + iVar1;
      iVar4 = iVar4 + iVar1;
    } while (iVar4 < this_01->delayslot);
    Address::operator+((Address *)&s,off);
    (this_01->naddr).base = _s;
    (this_01->naddr).offset = local_288;
    walker.point = this_01->base_state;
  }
  walker.cross_context = (ParserContext *)0x0;
  walker.depth = 0;
  walker.breadcrumb[0] = 0;
  this_00 = &this->pcode_cache;
  walker.const_context = this_01;
  PcodeCacher::clear(this_00);
  SleighBuilder::SleighBuilder
            (&builder,&walker,this->discache,this_00,
             (this->super_SleighBase).super_Translate.super_AddrSpaceManager.constantspace,
             (this->super_SleighBase).super_Translate.super_AddrSpaceManager.uniqspace,
             (this->super_SleighBase).unique_allocatemask);
  PcodeBuilder::build(&builder.super_PcodeBuilder,(walker.point)->ct->templ,-1);
  PcodeCacher::resolveRelatives(this_00);
  PcodeCacher::emit(this_00,baseaddr,emit);
  return iVar3;
}

Assistant:

int4 Sleigh::oneInstruction(PcodeEmit &emit,const Address &baseaddr) const

{
  int4 fallOffset;
  if (alignment != 1) {
    if ((baseaddr.getOffset() % alignment)!=0) {
      ostringstream s;
      s << "Instruction address not aligned: " << baseaddr;
      throw UnimplError(s.str(),0);
    }
  }
  
  ParserContext *pos = obtainContext(baseaddr,ParserContext::pcode);
  pos->applyCommits();
  fallOffset = pos->getLength();
  
  if (pos->getDelaySlot()>0) {
    int4 bytecount = 0;
    do {
    // Do not pass pos->getNaddr() to obtainContext, as pos may have been previously cached and had naddr adjusted
      ParserContext *delaypos = obtainContext(pos->getAddr() + fallOffset,ParserContext::pcode);
      delaypos->applyCommits();
      int4 len = delaypos->getLength();
      fallOffset += len;
      bytecount += len;
    } while(bytecount < pos->getDelaySlot());
    pos->setNaddr(pos->getAddr()+fallOffset);
  }
  ParserWalker walker(pos);
  walker.baseState();
  pcode_cache.clear();
  SleighBuilder builder(&walker,discache,&pcode_cache,getConstantSpace(),getUniqueSpace(),unique_allocatemask);
  try {
    builder.build(walker.getConstructor()->getTempl(),-1);
    pcode_cache.resolveRelatives();
    pcode_cache.emit(baseaddr,&emit);
  } catch(UnimplError &err) {
    ostringstream s;
    s << "Instruction not implemented in pcode:\n ";
    ParserWalker *cur = builder.getCurrentWalker();
    cur->baseState();
    Constructor *ct = cur->getConstructor();
    cur->getAddr().printRaw(s);
    s << ": ";
    ct->printMnemonic(s,*cur);
    s << "  ";
    ct->printBody(s,*cur);
    err.explain = s.str();
    err.instruction_length = fallOffset;
    throw err;
  }
  return fallOffset;
}